

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O3

SHARED_P shared_lock(int idx,int mode)

{
  SHARED_LTAB *pSVar1;
  int iVar2;
  BLKHEAD *pBVar3;
  int *piVar4;
  
  iVar2 = shared_mux(idx,mode);
  if (iVar2 != 0) {
    return (SHARED_P)0x0;
  }
  if ((shared_lt[idx].lkcnt == 0) || (iVar2 = shared_map(idx), iVar2 == 0)) {
    pBVar3 = shared_lt[idx].p;
    if (pBVar3 == (BLKHEAD *)0x0) {
      iVar2 = shared_map(idx);
      if (iVar2 != 0) goto LAB_0013acb2;
      pBVar3 = shared_lt[idx].p;
    }
    pSVar1 = shared_lt;
    if ((((pBVar3->s).ID[0] == 'J') && (*(char *)((long)pBVar3 + 1) == 'B')) &&
       (*(char *)((long)pBVar3 + 2) == '\x01')) {
      piVar4 = &shared_lt[idx].lkcnt;
      if ((mode & 1U) != 0) {
        *piVar4 = -1;
        piVar4 = &shared_gt[idx].nprocdebug;
      }
      *piVar4 = *piVar4 + 1;
      pSVar1[idx].seekpos = 0;
      return pBVar3 + 1;
    }
  }
LAB_0013acb2:
  shared_demux(idx,mode);
  return (SHARED_P)0x0;
}

Assistant:

SHARED_P shared_lock(int idx, int mode)         /* lock given segment for exclusive access */
 { int r;

   if (shared_mux(idx, mode))  return(NULL);    /* idx checked by shared_mux */
   if (0 != shared_lt[idx].lkcnt)               /* are we already locked ?? */
     if (SHARED_OK != (r = shared_map(idx)))
       { shared_demux(idx, mode); 
         return(NULL);
       }
   if (NULL == shared_lt[idx].p)                /* stupid pointer ?? */
     if (SHARED_OK != (r = shared_map(idx)))
       { shared_demux(idx, mode); 
         return(NULL);
       }
   if ((SHARED_ID_0 != (shared_lt[idx].p)->s.ID[0]) || (SHARED_ID_1 != (shared_lt[idx].p)->s.ID[1]) || (BLOCK_SHARED != (shared_lt[idx].p)->s.tflag))
     { shared_demux(idx, mode);
       return(NULL);
     }
   if (mode & SHARED_RDWRITE)
     { shared_lt[idx].lkcnt = -1;

       shared_gt[idx].nprocdebug++;
     }

   else shared_lt[idx].lkcnt++;
   shared_lt[idx].seekpos = 0L;                 /* r/w pointer positioned at beg of block */
   return((SHARED_P)((shared_lt[idx].p) + 1));
 }